

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

Status adios2sys::SystemTools::RemoveADirectory(string *source)

{
  bool bVar1;
  int iVar2;
  Status SVar3;
  unsigned_long uVar4;
  char *pcVar5;
  string *in_RDI;
  string fullPath;
  size_t fileNum;
  Directory dir;
  mode_t mode;
  Status status;
  string *in_stack_00000fe8;
  string *in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff10;
  mode_t in_stack_ffffffffffffff14;
  string *in_stack_ffffffffffffff18;
  mode_t *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  Directory *in_stack_ffffffffffffffa8;
  ulong local_50;
  anon_union_4_1_2e27bb9a_for_Status_2 aVar6;
  uint uVar7;
  Status local_8;
  
  uVar7 = 0;
  SVar3 = GetPermissions(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  aVar6 = SVar3.field_1;
  bVar1 = Status::operator_cast_to_bool((Status *)0xf38904);
  if (bVar1) {
    uVar7 = uVar7 | 0x180;
    SetPermissions(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                   SUB41((uint)in_stack_ffffffffffffff10 >> 0x18,0));
  }
  Status::Status(&local_8);
  Directory::Directory((Directory *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  local_8 = Directory::Load(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                            in_stack_ffffffffffffff98);
  bVar1 = Status::IsSuccess(&local_8);
  if (bVar1) {
    for (local_50 = 0; uVar4 = Directory::GetNumberOfFiles((Directory *)0xf38a00), local_50 < uVar4;
        local_50 = local_50 + 1) {
      pcVar5 = Directory::GetFile((Directory *)
                                  CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                  (unsigned_long)in_stack_ffffffffffffff08);
      iVar2 = strcmp(pcVar5,".");
      if (iVar2 != 0) {
        pcVar5 = Directory::GetFile((Directory *)
                                    CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                    (unsigned_long)in_stack_ffffffffffffff08);
        iVar2 = strcmp(pcVar5,"..");
        if (iVar2 != 0) {
          std::__cxx11::string::string((string *)&stack0xffffffffffffff90,in_RDI);
          std::__cxx11::string::operator+=((string *)&stack0xffffffffffffff90,"/");
          pcVar5 = Directory::GetFile((Directory *)
                                      CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                      (unsigned_long)in_stack_ffffffffffffff08);
          std::__cxx11::string::operator+=((string *)&stack0xffffffffffffff90,pcVar5);
          bVar1 = FileIsDirectory(in_stack_00000fe8);
          if ((!bVar1) || (bVar1 = FileIsSymlink(in_stack_ffffffffffffffa0), bVar1)) {
            local_8 = RemoveFile(in_stack_ffffffffffffff08);
            bVar1 = Status::IsSuccess(&local_8);
            in_stack_ffffffffffffff14 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff14);
            if (bVar1) {
LAB_00f38c01:
              bVar1 = false;
            }
            else {
              bVar1 = true;
            }
          }
          else {
            local_8 = RemoveADirectory((string *)CONCAT44(uVar7,aVar6.POSIX_));
            bVar1 = Status::IsSuccess(&local_8);
            if (bVar1) goto LAB_00f38c01;
            bVar1 = true;
          }
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
          if (bVar1) goto LAB_00f38c8b;
        }
      }
    }
    in_stack_ffffffffffffff10 = Rmdir((string *)0xf38c50);
    if (in_stack_ffffffffffffff10 != 0) {
      local_8 = Status::POSIX_errno();
    }
  }
LAB_00f38c8b:
  Directory::~Directory((Directory *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  return local_8;
}

Assistant:

Status SystemTools::RemoveADirectory(std::string const& source)
{
  // Add read and write permission to the directory so we can read
  // and modify its content to remove files and directories from it.
  mode_t mode = 0;
  if (SystemTools::GetPermissions(source, mode)) {
#if defined(_WIN32) && !defined(__CYGWIN__)
    mode |= S_IREAD | S_IWRITE;
#else
    mode |= S_IRUSR | S_IWUSR;
#endif
    SystemTools::SetPermissions(source, mode);
  }

  Status status;
  Directory dir;
  status = dir.Load(source);
  if (!status.IsSuccess()) {
    return status;
  }

  size_t fileNum;
  for (fileNum = 0; fileNum < dir.GetNumberOfFiles(); ++fileNum) {
    if (strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), ".") != 0 &&
        strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), "..") != 0) {
      std::string fullPath = source;
      fullPath += "/";
      fullPath += dir.GetFile(static_cast<unsigned long>(fileNum));
      if (SystemTools::FileIsDirectory(fullPath) &&
          !SystemTools::FileIsSymlink(fullPath)) {
        status = SystemTools::RemoveADirectory(fullPath);
        if (!status.IsSuccess()) {
          return status;
        }
      } else {
        status = SystemTools::RemoveFile(fullPath);
        if (!status.IsSuccess()) {
          return status;
        }
      }
    }
  }

  if (Rmdir(source) != 0) {
    status = Status::POSIX_errno();
  }
  return status;
}